

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O1

void rollback_without_seqtree(bool multi_kv)

{
  fdb_kvs_handle *handle;
  fdb_status fVar1;
  int iVar2;
  size_t sVar3;
  __atomic_base<unsigned_long> metalen;
  size_t bodylen;
  fdb_kvs_handle **ptr_handle;
  char *__s;
  char *pcVar4;
  undefined7 in_register_00000039;
  uint uVar5;
  ulong uVar6;
  btree *doc;
  fdb_kvs_handle *pfVar7;
  fdb_kvs_handle *handle_00;
  fdb_file_handle *dbfile;
  fdb_doc *rdoc;
  fdb_iterator *iterator;
  fdb_snapshot_info_t *markers;
  fdb_kvs_handle *snap_db;
  uint64_t num_markers;
  fdb_kvs_config kvs_config;
  char kv_name [8];
  timeval __test_begin;
  char metabuf [256];
  char keybuf [256];
  char bodybuf [256];
  fdb_config fconfig;
  fdb_kvs_handle *pfStack_848;
  fdb_kvs_handle *pfStack_840;
  fdb_file_handle *pfStack_838;
  fdb_iterator *pfStack_830;
  fdb_doc *pfStack_828;
  fdb_kvs_handle *pfStack_820;
  timeval tStack_818;
  fdb_kvs_config fStack_808;
  fdb_config fStack_7f0;
  fdb_config *pfStack_6f8;
  fdb_kvs_handle *pfStack_6f0;
  fdb_kvs_handle *pfStack_6e8;
  fdb_file_handle *pfStack_6e0;
  fdb_kvs_handle *pfStack_6d8;
  char acStack_6cf [15];
  filemgr *pfStack_6c0;
  docio_handle *pdStack_6b8;
  btreeblk_handle *pbStack_6b0;
  size_t sStack_6a8;
  filemgr *pfStack_6a0;
  docio_handle *pdStack_698;
  btreeblk_handle *pbStack_690;
  timeval tStack_688;
  undefined1 auStack_678 [76];
  uint uStack_62c;
  char *pcStack_538;
  atomic<unsigned_long> aStack_530;
  btree *pbStack_528;
  fdb_kvs_handle *pfStack_520;
  fdb_kvs_handle *pfStack_518;
  code *pcStack_510;
  uint local_4fc;
  fdb_txn *local_4f8;
  fdb_kvs_handle *local_4f0;
  fdb_iterator *local_4e8;
  fdb_snapshot_info_t *local_4e0;
  int local_4d4;
  fdb_kvs_handle *local_4d0;
  fdb_kvs_handle *local_4c8 [3];
  uint64_t local_4b0;
  fdb_kvs_config local_4a8;
  char local_490 [8];
  timeval local_488;
  char local_478 [256];
  btree local_378;
  char local_328 [256];
  char local_228 [256];
  fdb_config local_128;
  
  pcStack_510 = (code *)0x11c6e3;
  gettimeofday(&local_488,(__timezone_ptr_t)0x0);
  pcStack_510 = (code *)0x11c6e8;
  memleak_start();
  pcStack_510 = (code *)0x11c6f8;
  fdb_get_default_config();
  pcStack_510 = (code *)0x11c702;
  fdb_get_default_kvs_config();
  local_128.flags = 1;
  local_128.block_reusing_threshold = 0;
  local_128.seqtree_opt = '\0';
  pcStack_510 = (code *)0x11c728;
  local_128.multi_kv_instances = multi_kv;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_510 = (code *)0x11c73c;
  fdb_open((fdb_file_handle **)&local_4f8,"./mvcc_test1",&local_128);
  local_4d4 = (int)CONCAT71(in_register_00000039,multi_kv);
  if (local_4d4 == 0) {
    pcStack_510 = (code *)0x11c7a8;
    fdb_kvs_open_default((fdb_file_handle *)local_4f8,local_4c8,&local_4a8);
    pcVar4 = (char *)0x1;
  }
  else {
    ptr_handle = local_4c8;
    uVar6 = 0;
    do {
      pcStack_510 = (code *)0x11c76d;
      sprintf(local_490,"kv%d",uVar6 & 0xffffffff);
      pcStack_510 = (code *)0x11c780;
      fdb_kvs_open((fdb_file_handle *)local_4f8,ptr_handle,local_490,&local_4a8);
      uVar6 = uVar6 + 1;
      ptr_handle = ptr_handle + 1;
    } while (uVar6 != 3);
    pcVar4 = (char *)0x3;
  }
  local_4fc = 0;
  do {
    uVar6 = 0;
    do {
      pcStack_510 = (code *)0x11c7d4;
      sprintf(local_328,"key%d",uVar6 & 0xffffffff);
      pcStack_510 = (code *)0x11c7f5;
      sprintf(local_478,"meta-%d-%d",(ulong)local_4fc,uVar6 & 0xffffffff);
      pcStack_510 = (code *)0x11c814;
      sprintf(local_228,"body-%d-%d",(ulong)local_4fc,uVar6 & 0xffffffff);
      doc = (btree *)(&local_378.ksize + uVar6 * 8);
      pcStack_510 = (code *)0x11c827;
      sVar3 = strlen(local_328);
      pcStack_510 = (code *)0x11c837;
      metalen._M_i = strlen(local_478);
      pcStack_510 = (code *)0x11c842;
      bodylen = strlen(local_228);
      pcStack_510 = (code *)0x11c867;
      fdb_doc_create((fdb_doc **)doc,local_328,sVar3,local_478,metalen._M_i,local_228,bodylen);
      pfVar7 = (fdb_kvs_handle *)0x0;
      do {
        pcStack_510 = (code *)0x11c878;
        fdb_set(local_4c8[(long)pfVar7],*(fdb_doc **)doc);
        pfVar7 = (fdb_kvs_handle *)((long)pfVar7 + 1);
      } while ((fdb_kvs_handle *)pcVar4 != pfVar7);
      pcStack_510 = (code *)0x11c88d;
      fdb_doc_free(*(fdb_doc **)(&local_378.ksize + uVar6 * 8));
      uVar6 = uVar6 + 1;
    } while (uVar6 != 10);
    pcStack_510 = (code *)0x11c8b1;
    fdb_commit((fdb_file_handle *)local_4f8,~(byte)local_4fc & 1);
    local_4fc = local_4fc + 1;
    __s = (char *)(ulong)local_4fc;
  } while (local_4fc != 5);
  pcStack_510 = (code *)0x11c8d4;
  fVar1 = fdb_get_all_snap_markers((fdb_file_handle *)local_4f8,&local_4e0,&local_4b0);
  handle_00 = (fdb_kvs_handle *)0xa;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011cbd2;
  pcStack_510 = (code *)0x11c8f3;
  fVar1 = fdb_rollback(local_4c8,(local_4e0[3].kvs_markers)->seqnum);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011cbd7;
  local_4f0 = (fdb_kvs_handle *)0x0;
  __s = local_228;
  handle_00 = (fdb_kvs_handle *)0x0;
  do {
    pcStack_510 = (code *)0x11c928;
    fVar1 = fdb_snapshot_open(local_4c8[(long)handle_00],&local_4d0,0xffffffffffffffff);
    if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_0011cbb9:
      pcStack_510 = (code *)0x11cbbe;
      rollback_without_seqtree();
LAB_0011cbbe:
      pcStack_510 = (code *)0x11cbc3;
      rollback_without_seqtree();
LAB_0011cbc3:
      pcStack_510 = (code *)0x11cbc8;
      rollback_without_seqtree();
LAB_0011cbc8:
      pcStack_510 = (code *)0x11cbcd;
      rollback_without_seqtree();
      goto LAB_0011cbcd;
    }
    pcStack_510 = (code *)0x11c950;
    fVar1 = fdb_iterator_init(local_4d0,&local_4e8,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_0011cbb4:
      pcStack_510 = (code *)0x11cbb9;
      rollback_without_seqtree();
      goto LAB_0011cbb9;
    }
    metalen._M_i = 0;
    do {
      pcStack_510 = (code *)0x11c96a;
      fVar1 = fdb_iterator_get(local_4e8,(fdb_doc **)&local_4f0);
      if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_0011cb8f:
        pcStack_510 = (code *)0x11cb94;
        rollback_without_seqtree();
LAB_0011cb94:
        pcStack_510 = (code *)0x11cba4;
        rollback_without_seqtree();
LAB_0011cba4:
        pcStack_510 = (code *)0x11cbb4;
        rollback_without_seqtree();
        goto LAB_0011cbb4;
      }
      pcStack_510 = (code *)0x11c98b;
      sprintf(local_328,"key%d",metalen._M_i);
      if (handle_00 == (fdb_kvs_handle *)0x0) {
        pcStack_510 = (code *)0x11c9da;
        sprintf(local_478,"meta-1-%d",metalen._M_i);
        pcStack_510 = (code *)0x11c9ee;
        sprintf(__s,"body-1-%d",metalen._M_i);
      }
      else {
        pcStack_510 = (code *)0x11c9ae;
        sprintf(local_478,"meta-%d-%d",4,metalen._M_i);
        pcStack_510 = (code *)0x11c9c7;
        sprintf(__s,"body-%d-%d",4);
      }
      pfVar7 = local_4f0;
      doc = (btree *)local_4f0->op_stats;
      pcStack_510 = (code *)0x11ca0a;
      iVar2 = bcmp(doc,local_328,*(size_t *)&local_4f0->kvs_config);
      if (iVar2 != 0) {
        pcStack_510 = (code *)0x11cb8f;
        rollback_without_seqtree();
        goto LAB_0011cb8f;
      }
      doc = pfVar7->staletree;
      pcStack_510 = (code *)0x11ca2a;
      iVar2 = bcmp(doc,local_478,(size_t)(pfVar7->kvs_config).custom_cmp);
      if (iVar2 != 0) goto LAB_0011cba4;
      doc = (pfVar7->field_6).seqtree;
      pcStack_510 = (code *)0x11ca45;
      iVar2 = bcmp(doc,__s,(size_t)(pfVar7->kvs_config).custom_cmp_param);
      if (iVar2 != 0) goto LAB_0011cb94;
      pcStack_510 = (code *)0x11ca55;
      fdb_doc_free((fdb_doc *)pfVar7);
      local_4f0 = (fdb_kvs_handle *)0x0;
      uVar5 = (int)metalen._M_i + 1;
      metalen._M_i = (__int_type)uVar5;
      pcStack_510 = (code *)0x11ca6b;
      fVar1 = fdb_iterator_next(local_4e8);
    } while (fVar1 != FDB_RESULT_ITERATOR_FAIL);
    if (uVar5 != 10) goto LAB_0011cbbe;
    pcStack_510 = (code *)0x11ca88;
    fVar1 = fdb_iterator_close(local_4e8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011cbc3;
    pcStack_510 = (code *)0x11ca9a;
    fVar1 = fdb_kvs_close(local_4d0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011cbc8;
    handle_00 = (fdb_kvs_handle *)&(handle_00->kvs_config).field_0x1;
  } while (handle_00 != (fdb_kvs_handle *)pcVar4);
  __s = (char *)0x0;
  do {
    pcStack_510 = (code *)0x11caba;
    fVar1 = fdb_kvs_close(local_4c8[(long)__s]);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011cbcd;
    __s = __s + 1;
  } while (pcVar4 != __s);
  pcStack_510 = (code *)0x11cadd;
  fVar1 = fdb_rollback_all((fdb_file_handle *)local_4f8,local_4e0[3].marker);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011cbdc;
  pcStack_510 = (code *)0x11caf4;
  fVar1 = fdb_free_snap_markers(local_4e0,local_4b0);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pcStack_510 = (code *)0x11cb06;
    fdb_close((fdb_file_handle *)local_4f8);
    pcStack_510 = (code *)0x11cb0b;
    fdb_shutdown();
    pcStack_510 = (code *)0x11cb10;
    memleak_end();
    pcVar4 = "single kv mode:";
    if ((char)local_4d4 != '\0') {
      pcVar4 = "multiple kv mode:";
    }
    pcStack_510 = (code *)0x11cb40;
    sprintf(local_228,"rollback without seqtree in %s",pcVar4);
    pcVar4 = "%s PASSED\n";
    if (rollback_without_seqtree(bool)::__test_pass != '\0') {
      pcVar4 = "%s FAILED\n";
    }
    pcStack_510 = (code *)0x11cb6d;
    fprintf(_stderr,pcVar4,local_228);
    return;
  }
LAB_0011cbe1:
  pcStack_510 = tx_crash_recover_test;
  rollback_without_seqtree();
  pfStack_6e8 = (fdb_kvs_handle *)0x11cc03;
  pcStack_538 = __s;
  aStack_530.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)metalen._M_i;
  pbStack_528 = doc;
  pfStack_520 = pfVar7;
  pfStack_518 = handle_00;
  pcStack_510 = (code *)pcVar4;
  gettimeofday(&tStack_688,(__timezone_ptr_t)0x0);
  pfStack_6e8 = (fdb_kvs_handle *)0x11cc08;
  memleak_start();
  pfStack_6e8 = (fdb_kvs_handle *)0x11cc14;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcVar4 = auStack_678 + 0x48;
  pfStack_6e8 = (fdb_kvs_handle *)0x11cc24;
  fdb_get_default_config();
  pfStack_6e8 = (fdb_kvs_handle *)0x11cc36;
  fVar1 = fdb_open(&pfStack_6e0,"./mvcc_test2",(fdb_config *)pcVar4);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pcVar4 = auStack_678;
    pfStack_6e8 = (fdb_kvs_handle *)0x11cc4b;
    fdb_get_default_kvs_config();
    pbStack_690 = (btreeblk_handle *)auStack_678._16_8_;
    pfStack_6a0 = (filemgr *)auStack_678._0_8_;
    pdStack_698 = (docio_handle *)auStack_678._8_8_;
    pfStack_6e8 = (fdb_kvs_handle *)0x11cc6c;
    fVar1 = fdb_kvs_open_default(pfStack_6e0,&pfStack_6d8,(fdb_kvs_config *)&pfStack_6a0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011cf77;
    pfStack_6e8 = (fdb_kvs_handle *)0x11cc82;
    fVar1 = fdb_begin_transaction(pfStack_6e0,'\x03');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011cf7c;
    pcVar4 = "key%d";
    pfVar7 = (fdb_kvs_handle *)acStack_6cf;
    handle_00 = (fdb_kvs_handle *)0x1565bd;
    uVar6 = 0;
    do {
      pfStack_6e8 = (fdb_kvs_handle *)0x11ccae;
      sprintf((char *)pfVar7,"key%d",uVar6);
      handle = pfStack_6d8;
      pfStack_6e8 = (fdb_kvs_handle *)0x11ccbb;
      sVar3 = strlen((char *)pfVar7);
      pfStack_6e8 = (fdb_kvs_handle *)0x11ccd2;
      fVar1 = fdb_set_kv(handle,pfVar7,sVar3,"value",5);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pfStack_6e8 = (fdb_kvs_handle *)0x11cf63;
        tx_crash_recover_test();
        goto LAB_0011cf63;
      }
      uVar5 = (int)uVar6 + 1;
      uVar6 = (ulong)uVar5;
    } while (uVar5 != 10);
    pfStack_6e8 = (fdb_kvs_handle *)0x11ccef;
    fVar1 = fdb_end_transaction(pfStack_6e0,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011cf81;
    pfStack_6e8 = (fdb_kvs_handle *)0x11cd07;
    fdb_compact(pfStack_6e0,"./mvcc_test3");
    pfStack_6e8 = (fdb_kvs_handle *)0x11cd15;
    fVar1 = fdb_begin_transaction(pfStack_6e0,'\x03');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011cf86;
    pcVar4 = "key%d";
    pfVar7 = (fdb_kvs_handle *)acStack_6cf;
    uVar5 = 0;
    do {
      pfStack_6e8 = (fdb_kvs_handle *)0x11cd3a;
      sprintf((char *)pfVar7,"key%d",(ulong)uVar5);
      handle_00 = pfStack_6d8;
      pfStack_6e8 = (fdb_kvs_handle *)0x11cd47;
      sVar3 = strlen((char *)pfVar7);
      pfStack_6e8 = (fdb_kvs_handle *)0x11cd55;
      fVar1 = fdb_del_kv(handle_00,pfVar7,sVar3);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011cf63;
      uVar5 = uVar5 + 1;
    } while (uVar5 != 10);
    pfStack_6e8 = (fdb_kvs_handle *)0x11cd72;
    fVar1 = fdb_get_file_info(pfStack_6e0,(fdb_file_info *)auStack_678);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011cf8b;
    pcVar4 = (char *)((ulong)auStack_678._40_8_ / (ulong)uStack_62c);
    pfStack_6e8 = (fdb_kvs_handle *)0x11cd9a;
    fdb_close(pfStack_6e0);
    pfStack_6e8 = (fdb_kvs_handle *)0x11cd9f;
    fdb_shutdown();
    pfStack_6e8 = (fdb_kvs_handle *)0x11cdbe;
    iVar2 = _disk_dump("./mvcc_test3",(ulong)uStack_62c * (long)pcVar4,
                       (ulong)((uStack_62c >> 2) + uStack_62c * 2));
    if (iVar2 < 0) goto LAB_0011cf90;
    pfStack_6e8 = (fdb_kvs_handle *)0x11cde8;
    iVar2 = _disk_dump("./mvcc_test2",((long)pcVar4 * 4 + 8) * (ulong)uStack_62c,
                       (ulong)(uStack_62c >> 2));
    if (iVar2 < 0) goto LAB_0011cf95;
    pfStack_6e8 = (fdb_kvs_handle *)0x11ce07;
    fVar1 = fdb_open(&pfStack_6e0,"./mvcc_test3",(fdb_config *)(auStack_678 + 0x48));
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011cf9a;
    pcVar4 = (char *)&pfStack_6c0;
    pfStack_6e8 = (fdb_kvs_handle *)0x11ce1c;
    fdb_get_default_kvs_config();
    pbStack_690 = pbStack_6b0;
    pfStack_6a0 = pfStack_6c0;
    pdStack_698 = pdStack_6b8;
    pfStack_6e8 = (fdb_kvs_handle *)0x11ce3d;
    fVar1 = fdb_kvs_open_default(pfStack_6e0,&pfStack_6d8,(fdb_kvs_config *)&pfStack_6a0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011cf9f;
    pfStack_6e8 = (fdb_kvs_handle *)0x11ce53;
    fVar1 = fdb_begin_transaction(pfStack_6e0,'\x03');
    if (fVar1 == FDB_RESULT_SUCCESS) {
      uVar5 = 0;
      do {
        pfStack_6e8 = (fdb_kvs_handle *)0x11ce78;
        sprintf(acStack_6cf,"key%d",(ulong)uVar5);
        handle_00 = pfStack_6d8;
        pfStack_6e8 = (fdb_kvs_handle *)0x11ce85;
        sVar3 = strlen(acStack_6cf);
        pfStack_6e8 = (fdb_kvs_handle *)0x11ce93;
        fVar1 = fdb_del_kv(handle_00,acStack_6cf,sVar3);
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011cf68;
        uVar5 = uVar5 + 1;
      } while (uVar5 != 10);
      pfStack_6e8 = (fdb_kvs_handle *)0x11ceab;
      fdb_abort_transaction(pfStack_6e0);
      handle_00 = (fdb_kvs_handle *)&pfStack_6c0;
      uVar5 = 0;
      while( true ) {
        pfStack_6e8 = (fdb_kvs_handle *)0x11ced2;
        sprintf(acStack_6cf,"key%d",(ulong)uVar5);
        pfVar7 = pfStack_6d8;
        pfStack_6e8 = (fdb_kvs_handle *)0x11cedf;
        sVar3 = strlen(acStack_6cf);
        pfStack_6e8 = (fdb_kvs_handle *)0x11cef3;
        fVar1 = fdb_get_kv(pfVar7,acStack_6cf,sVar3,(void **)handle_00,&sStack_6a8);
        if (fVar1 != FDB_RESULT_SUCCESS) break;
        pfStack_6e8 = (fdb_kvs_handle *)0x11cf01;
        free(pfStack_6c0);
        uVar5 = uVar5 + 1;
        if (uVar5 == 10) {
          pfStack_6e8 = (fdb_kvs_handle *)0x11cf11;
          fdb_close(pfStack_6e0);
          pfStack_6e8 = (fdb_kvs_handle *)0x11cf16;
          fdb_shutdown();
          pfStack_6e8 = (fdb_kvs_handle *)0x11cf1b;
          memleak_end();
          pcVar4 = "%s PASSED\n";
          if (tx_crash_recover_test()::__test_pass != '\0') {
            pcVar4 = "%s FAILED\n";
          }
          pfStack_6e8 = (fdb_kvs_handle *)0x11cf4c;
          fprintf(_stderr,pcVar4,"crash recover test");
          return;
        }
      }
LAB_0011cf6d:
      pfVar7 = (fdb_kvs_handle *)acStack_6cf;
      pcVar4 = "key%d";
      pfStack_6e8 = (fdb_kvs_handle *)0x11cf72;
      tx_crash_recover_test();
      goto LAB_0011cf72;
    }
  }
  else {
LAB_0011cf72:
    pfStack_6e8 = (fdb_kvs_handle *)0x11cf77;
    tx_crash_recover_test();
LAB_0011cf77:
    pfStack_6e8 = (fdb_kvs_handle *)0x11cf7c;
    tx_crash_recover_test();
LAB_0011cf7c:
    pfStack_6e8 = (fdb_kvs_handle *)0x11cf81;
    tx_crash_recover_test();
LAB_0011cf81:
    pfStack_6e8 = (fdb_kvs_handle *)0x11cf86;
    tx_crash_recover_test();
LAB_0011cf86:
    pfStack_6e8 = (fdb_kvs_handle *)0x11cf8b;
    tx_crash_recover_test();
LAB_0011cf8b:
    pfStack_6e8 = (fdb_kvs_handle *)0x11cf90;
    tx_crash_recover_test();
LAB_0011cf90:
    pfStack_6e8 = (fdb_kvs_handle *)0x11cf95;
    tx_crash_recover_test();
LAB_0011cf95:
    pfStack_6e8 = (fdb_kvs_handle *)0x11cf9a;
    tx_crash_recover_test();
LAB_0011cf9a:
    pfStack_6e8 = (fdb_kvs_handle *)0x11cf9f;
    tx_crash_recover_test();
LAB_0011cf9f:
    pfStack_6e8 = (fdb_kvs_handle *)0x11cfa4;
    tx_crash_recover_test();
  }
  pfStack_6e8 = (fdb_kvs_handle *)drop_kv_on_snap_iterator_test;
  tx_crash_recover_test();
  pfStack_6f8 = (fdb_config *)pcVar4;
  pfStack_6f0 = pfVar7;
  pfStack_6e8 = handle_00;
  gettimeofday(&tStack_818,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  pfStack_828 = (fdb_doc *)0x0;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_open(&pfStack_838,"./mvcc_test1",&fStack_7f0);
  fdb_kvs_open_default(pfStack_838,&pfStack_820,&fStack_808);
  fdb_kvs_open(pfStack_838,&pfStack_840,"kv",&fStack_808);
  fVar1 = fdb_set_kv(pfStack_840,"a",1,(void *)0x0,0);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fVar1 = fdb_set_kv(pfStack_840,"b",1,(void *)0x0,0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011d1c2;
    fdb_commit(pfStack_838,'\x01');
    fVar1 = fdb_snapshot_open(pfStack_840,&pfStack_848,2);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011d1c9;
    fVar1 = fdb_iterator_init(pfStack_848,&pfStack_830,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011d1ce;
    fVar1 = fdb_kvs_close(pfStack_848);
    if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_0011d1d3;
    fVar1 = fdb_kvs_close(pfStack_840);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011d1d8;
    fVar1 = fdb_kvs_remove(pfStack_838,"kv");
    if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_0011d1dd;
    fVar1 = fdb_iterator_get(pfStack_830,&pfStack_828);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011d1e2;
    fdb_doc_free(pfStack_828);
    fVar1 = fdb_iterator_close(pfStack_830);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011d1e7;
    fVar1 = fdb_kvs_close(pfStack_848);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011d1ec;
    fVar1 = fdb_kvs_close(pfStack_820);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      fVar1 = fdb_close(pfStack_838);
      if (fVar1 == FDB_RESULT_SUCCESS) {
        fdb_shutdown();
        memleak_end();
        pcVar4 = "%s PASSED\n";
        if (drop_kv_on_snap_iterator_test()::__test_pass != '\0') {
          pcVar4 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar4,"drop kv other handle test");
        return;
      }
      goto LAB_0011d1f6;
    }
  }
  else {
    drop_kv_on_snap_iterator_test();
LAB_0011d1c2:
    drop_kv_on_snap_iterator_test();
LAB_0011d1c9:
    drop_kv_on_snap_iterator_test();
LAB_0011d1ce:
    drop_kv_on_snap_iterator_test();
LAB_0011d1d3:
    drop_kv_on_snap_iterator_test();
LAB_0011d1d8:
    drop_kv_on_snap_iterator_test();
LAB_0011d1dd:
    drop_kv_on_snap_iterator_test();
LAB_0011d1e2:
    drop_kv_on_snap_iterator_test();
LAB_0011d1e7:
    drop_kv_on_snap_iterator_test();
LAB_0011d1ec:
    drop_kv_on_snap_iterator_test();
  }
  drop_kv_on_snap_iterator_test();
LAB_0011d1f6:
  drop_kv_on_snap_iterator_test();
  concurrent_writer_iterator_test();
  in_memory_snapshot_cleanup_test();
  drop_kv_on_snap_iterator_test();
  rollback_secondary_kvs();
  multi_version_test();
  crash_recovery_test(true);
  crash_recovery_test(false);
  snapshot_test();
  in_memory_snapshot_rollback_test();
  in_memory_snapshot_test();
  in_memory_snapshot_on_dirty_hbtrie_test();
  in_memory_snapshot_compaction_test();
  snapshot_clone_test();
  snapshot_parallel_clone_test();
  snapshot_stats_test();
  snapshot_with_uncomitted_data_test();
  snapshot_markers_in_file_test(true);
  snapshot_markers_in_file_test(false);
  snapshot_with_deletes_test();
  snapshot_without_seqtree(true);
  snapshot_without_seqtree(false);
  rollback_during_ops_test((void *)0x0);
  rollback_forward_seqnum();
  rollback_test(false);
  rollback_test(true);
  rollback_and_snapshot_test();
  rollback_ncommits();
  transaction_test();
  transaction_simple_api_test();
  transaction_in_memory_snapshot_test();
  rollback_prior_to_ops(true);
  rollback_prior_to_ops(false);
  snapshot_concurrent_compaction_test();
  rollback_to_zero_test(true);
  rollback_to_zero_test(false);
  rollback_to_zero_after_compact_test(false);
  rollback_to_zero_after_compact_test(true);
  rollback_all_test(true);
  rollback_all_test(false);
  rollback_to_wal_test(true);
  rollback_to_wal_test(false);
  rollback_drop_multi_files_kvs_test();
  rollback_without_seqtree(true);
  rollback_without_seqtree(false);
  tx_crash_recover_test();
  auto_compaction_snapshots_test();
  return;
LAB_0011cbcd:
  pcStack_510 = (code *)0x11cbd2;
  rollback_without_seqtree();
LAB_0011cbd2:
  pcStack_510 = (code *)0x11cbd7;
  rollback_without_seqtree();
LAB_0011cbd7:
  pcStack_510 = (code *)0x11cbdc;
  rollback_without_seqtree();
LAB_0011cbdc:
  pcStack_510 = (code *)0x11cbe1;
  rollback_without_seqtree();
  goto LAB_0011cbe1;
LAB_0011cf63:
  pfStack_6e8 = (fdb_kvs_handle *)0x11cf68;
  tx_crash_recover_test();
LAB_0011cf68:
  pfStack_6e8 = (fdb_kvs_handle *)0x11cf6d;
  tx_crash_recover_test();
  goto LAB_0011cf6d;
}

Assistant:

void rollback_without_seqtree(bool multi_kv)
{
    TEST_INIT();

    memleak_start();

    int i, j, r;
    int n = 10;
    int num_commits = 5, num_kvs = 3;
    fdb_file_handle *dbfile;
    fdb_kvs_handle **db = alca(fdb_kvs_handle *, num_kvs);
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_status status;
    fdb_snapshot_info_t *markers;
    uint64_t num_markers;

    char keybuf[256], metabuf[256], bodybuf[256];
    char kv_name[8];

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.multi_kv_instances = multi_kv;
    // for creating the strict number of snapshots, disable block reusing
    fconfig.block_reusing_threshold = 0;
    fconfig.seqtree_opt = FDB_SEQTREE_NOT_USE;

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    // open db
    fdb_open(&dbfile, "./mvcc_test1", &fconfig);
    if (multi_kv) {
        for (r = 0; r < num_kvs; ++r) {
            sprintf(kv_name, "kv%d", r);
            fdb_kvs_open(dbfile, &db[r], kv_name, &kvs_config);
        }
    } else {
        num_kvs = 1;
        fdb_kvs_open_default(dbfile, &db[0], &kvs_config);
    }

    // Load documents mulitple times
    for (j=0; j < num_commits; ++j) {
        for (i=0; i<n; i++){
            sprintf(keybuf, "key%d", i);
            sprintf(metabuf, "meta-%d-%d", j, i);
            sprintf(bodybuf, "body-%d-%d", j, i);
            fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
                           (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
            for (r = 0; r < num_kvs; ++r) {
                fdb_set(db[r], doc[i]);
            }
            fdb_doc_free(doc[i]);
        }
        if (j % 2 == 0) {
            fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        } else {
            fdb_commit(dbfile, FDB_COMMIT_NORMAL);
        }
    }

    status = fdb_get_all_snap_markers(dbfile, &markers, &num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Rollback the first KV store to the second commit point
    status = fdb_rollback(&db[0], markers[3].kvs_markers[0].seqnum);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_kvs_handle *snap_db;
    fdb_iterator *iterator;
    fdb_doc *rdoc = NULL;
    // Create an in-memory snapshot for each KV store and verify all the keys.
    for (r = 0; r < num_kvs; ++r) {
        status = fdb_snapshot_open(db[r], &snap_db, FDB_SNAPSHOT_INMEM);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // Verify all the keys in the snapshot
        status = fdb_iterator_init(snap_db, &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        i=0;
        do {
            status = fdb_iterator_get(iterator, &rdoc);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            sprintf(keybuf, "key%d", i);
            if (r == 0) {
                // The first KV store should only have KV items from the second commit.
                sprintf(metabuf, "meta-1-%d", i);
                sprintf(bodybuf, "body-1-%d", i);
            } else {
                sprintf(metabuf, "meta-%d-%d", num_commits - 1, i);
                sprintf(bodybuf, "body-%d-%d", num_commits - 1, i);
            }
            TEST_CMP(rdoc->key, keybuf, rdoc->keylen);
            TEST_CMP(rdoc->meta, metabuf, rdoc->metalen);
            TEST_CMP(rdoc->body, bodybuf, rdoc->bodylen);
            fdb_doc_free(rdoc);
            rdoc = NULL;
            i++;
        } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
        TEST_CHK(i==n);
        status = fdb_iterator_close(iterator);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        status = fdb_kvs_close(snap_db);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // Close all the KV store handles
    for (r = 0; r < num_kvs; ++r) {
        status = fdb_kvs_close(db[r]);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }
    // Rollback all the KV stores to the second commit point
    status = fdb_rollback_all(dbfile, markers[3].marker);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_free_snap_markers(markers, num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // close db file
    fdb_close(dbfile);

    // free all resources
    fdb_shutdown();

    memleak_end();

    sprintf(bodybuf, "rollback without seqtree in %s",
            multi_kv ? "multiple kv mode:" : "single kv mode:");
    TEST_RESULT(bodybuf);
}